

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

void __thiscall CLabelTable::DumpForCSpect(CLabelTable *this)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  mapped_type *pmVar6;
  char *pcVar7;
  SLabelTableEntry *pSVar8;
  key_type *name;
  pointer __k;
  undefined8 uStack_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  order;
  
  __stream = (FILE *)SJ_fopen((path *)Options::CSpectMapFName_abi_cxx11_,"w");
  if (__stream == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string
              ((string *)&order,(path *)Options::CSpectMapFName_abi_cxx11_);
    Error("opening file for write",
          (char *)order.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,FATAL);
    std::__cxx11::string::~string((string *)&order);
  }
  iVar3 = Options::CSpectMapPageSize;
  uVar4 = Options::CSpectMapPageSize - 1;
  getDumpOrder(&order,&this->symbols);
  __k = order.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__k == order.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      fclose(__stream);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&order);
      return;
    }
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
             ::at(&this->symbols,__k);
    sVar1 = pmVar6->page;
    if (sVar1 != -1) {
      uVar2 = pmVar6->traits;
      if ((uVar2 & 0x10) == 0) {
        iVar5 = 0;
        if ((uVar2 & 8) == 0) {
          if ((uVar2 & 4) == 0) {
            if ((uVar2 & 2) == 0) {
              uStack_70 = 3;
              iVar5 = 0;
              if (sVar1 < 0x7f00) goto LAB_0012c62d;
            }
            else {
              uStack_70 = 2;
            }
          }
          else {
            uStack_70 = 1;
          }
        }
        else {
          uStack_70 = 4;
        }
      }
      else {
LAB_0012c62d:
        uStack_70 = 0;
        iVar5 = (int)sVar1;
      }
      fprintf(__stream,"%08X %08X %02X ",(ulong)(pmVar6->value & 0xffff),
              (ulong)(iVar5 * iVar3 + (pmVar6->value & uVar4)),uStack_70);
      strcpy(temp,(__k->_M_dataplus)._M_p);
      pcVar7 = strrchr(temp,0x2e);
LAB_0012c677:
      if (temp < pcVar7) {
        *pcVar7 = '\0';
        pSVar8 = Find(this,temp,true);
        if (pSVar8 != (SLabelTableEntry *)0x0) {
          *pcVar7 = '@';
          goto LAB_0012c6bf;
        }
        *pcVar7 = '.';
        do {
          pcVar7 = pcVar7 + -1;
          if (pcVar7 <= temp) {
            pcVar7 = temp;
            break;
          }
        } while (*pcVar7 != '.');
        goto LAB_0012c677;
      }
LAB_0012c6bf:
      pcVar7 = temp;
      do {
        iVar5 = toupper((uint)(byte)*pcVar7);
        *pcVar7 = (byte)iVar5;
        pcVar7 = (char *)((byte *)pcVar7 + 1);
      } while ((byte)iVar5 != 0);
      fprintf(__stream,"%s\n",temp);
    }
    __k = __k + 1;
  } while( true );
}

Assistant:

void CLabelTable::DumpForCSpect() {
	FILE* file;
	if (!FOPEN_ISOK(file, Options::CSpectMapFName, "w")) {
		Error("opening file for write", Options::CSpectMapFName.string().c_str(), FATAL);
	}
	const int CSD_PAGE_SIZE = Options::CSpectMapPageSize;
	const int CSD_PAGE_MASK = CSD_PAGE_SIZE - 1;
	const auto order = getDumpOrder(symbols);
	for (const symbol_map_t::key_type& name: order) {
		const symbol_map_t::mapped_type& symbol = symbols.at(name);
		if (LABEL_PAGE_UNDEFINED == symbol.page) continue;
		const int labelType =
			(symbol.traits&LABEL_IS_STRUCT_E) ? 0 :
			(symbol.traits&LABEL_IS_STRUCT_D) ? 4 :
			(symbol.traits&LABEL_IS_EQU) ? 1 :
			(symbol.traits&LABEL_IS_DEFL) ? 2 :
			(LABEL_PAGE_ROM <= symbol.page) ? 3 : 0;
		const short page = labelType ? 0 : symbol.page;
			// TODO:
			// page == -1 will put regular EQU like "BLUE" out of reach for disassembly window
			// (otherwise BLUE becomes label for address $C001 with default mapping)
			// BUT then it would be nice to provide real page data for equ which have them explicit
			// BUT I can't distinguish explicit/implicit page number, as there's heuristic to use current mapping
			// instead of using the LABEL_PAGE_OUT_OF_BOUNDS page number...
			// TODO: figure out when/why the implicit page number heuristic happenned and if you can detect
			// only explicit page numbers used in EQU, and export only those

		const aint longAddress = (CSD_PAGE_MASK & symbol.value) + page * CSD_PAGE_SIZE;
		fprintf(file, "%08X %08X %02X ", 0xFFFF & symbol.value, longAddress, labelType);
		// convert primary+local label to be "@" delimited (not "." delimited)
		STRCPY(temp, LINEMAX, name.c_str());
		// look for "primary" label (where the local label starts)
		char* localLabelStart = strrchr(temp, '.');
		while (temp < localLabelStart) {	// the dot must be at least second character
			*localLabelStart = 0;			// terminate the possible "primary" part
			if (Find(temp, true)) {
				*localLabelStart = '@';
				break;
			}
			*localLabelStart = '.';			// "primary" label didn't work, restore dot
			do {
				--localLabelStart;			// and look for next dot
			} while (temp < localLabelStart && '.' != *localLabelStart);
		}
		// convert whole label to upper-case, as CSpect search is malfunctioning otherwise.
		char* strToUpper = temp;
		while ((*strToUpper = (char) toupper((byte)*strToUpper))) { ++strToUpper; }
		fprintf(file, "%s\n", temp);
	}
	fclose(file);
}